

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_fd.c
# Opt level: O1

int64_t file_seek(archive_conflict *a,void *client_data,int64_t request,wchar_t whence)

{
  int iVar1;
  __off_t _Var2;
  int *piVar3;
  char *fmt;
  
  _Var2 = lseek(*client_data,request,whence);
  if (-1 < _Var2) {
    return _Var2;
  }
  iVar1 = *(int *)((long)client_data + 0x20);
  piVar3 = __errno_location();
  if (iVar1 == 1) {
    fmt = "Error seeking in \'%s\'";
  }
  else {
    if (iVar1 == 0) {
      archive_set_error((archive *)a,*piVar3,"Error seeking in stdin");
      return -0x1e;
    }
    fmt = "Error seeking in \'%ls\'";
  }
  archive_set_error((archive *)a,*piVar3,fmt,(long)client_data + 0x24);
  return -0x1e;
}

Assistant:

static int64_t
file_seek(struct archive *a, void *client_data, int64_t request, int whence)
{
	struct read_fd_data *mine = (struct read_fd_data *)client_data;
	int64_t r;

	/* We use off_t here because lseek() is declared that way. */
	/* See above for notes about when off_t is less than 64 bits. */
	r = lseek(mine->fd, request, whence);
	if (r >= 0)
		return r;

	if (errno == ESPIPE) {
		archive_set_error(a, errno,
		    "A file descriptor(%d) is not seekable(PIPE)", mine->fd);
		return (ARCHIVE_FAILED);
	} else {
		/* If the input is corrupted or truncated, fail. */
		archive_set_error(a, errno,
		    "Error seeking in a file descriptor(%d)", mine->fd);
		return (ARCHIVE_FATAL);
	}
}